

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBUAcontig8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *m;
  uint32_t a;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar2 = img->samplesperpixel;
  _y_local = cp;
  for (r = h; w_local = w, r != 0; r = r - 1) {
    for (; w_local != 0; w_local = w_local - 1) {
      bVar1 = pp[3];
      puVar3 = img->UaToAa;
      *_y_local = CONCAT13(bVar1,CONCAT12(puVar3[(ulong)pp[2] + (ulong)bVar1 * 0x100],
                                          CONCAT11(puVar3[(ulong)pp[1] + (ulong)bVar1 * 0x100],
                                                   puVar3[(ulong)*pp + (ulong)bVar1 * 0x100])));
      pp = pp + (int)(uint)uVar2;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    pp = pp + (int)((uint)uVar2 * fromskew);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBUAcontig8bittile)
{
    int samplesperpixel = img->samplesperpixel;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        uint32_t r, g, b, a;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            a = pp[3];
            m = img->UaToAa + ((size_t)a << 8);
            r = m[pp[0]];
            g = m[pp[1]];
            b = m[pp[2]];
            *cp++ = PACK4(r, g, b, a);
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}